

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginDataSegment
          (BinaryReaderIR *this,Index index,Index memory_index,uint8_t flags)

{
  undefined8 uVar1;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_a8;
  undefined1 local_a0 [40];
  Var local_78;
  
  GetLocation(&local_78.loc,this);
  std::make_unique<wabt::DataSegmentModuleField,wabt::Location>((Location *)local_a0);
  uVar1 = local_a0._0_8_;
  GetLocation((Location *)(local_a0 + 8),this);
  Var::Var(&local_78,memory_index,(Location *)(local_a0 + 8));
  Var::operator=(&((DataSegment *)(uVar1 + 0x40))->memory_var,&local_78);
  Var::~Var(&local_78);
  ((DataSegment *)(uVar1 + 0x40))->kind = flags & Passive;
  local_a8._M_head_impl = (DataSegmentModuleField *)local_a0._0_8_;
  local_a0._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                       *)&local_a8);
  if (local_a8._M_head_impl != (DataSegmentModuleField *)0x0) {
    (*((local_a8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_a8._M_head_impl = (DataSegmentModuleField *)0x0;
  if ((long *)local_a0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginDataSegment(Index index,
                                        Index memory_index,
                                        uint8_t flags) {
  auto field = std::make_unique<DataSegmentModuleField>(GetLocation());
  DataSegment& data_segment = field->data_segment;
  data_segment.memory_var = Var(memory_index, GetLocation());
  if ((flags & SegPassive) == SegPassive) {
    data_segment.kind = SegmentKind::Passive;
  } else {
    data_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}